

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_solution.h
# Opt level: O0

void writeResult(Result *sol,ostream *f)

{
  ostream *poVar1;
  void *this;
  ostream *f_local;
  Result *sol_local;
  
  poVar1 = std::operator<<(f,"Instance: ");
  poVar1 = std::operator<<(poVar1,(string *)sol);
  poVar1 = std::operator<<(poVar1," branches: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sol->nBranchings);
  poVar1 = std::operator<<(poVar1," time: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sol->time);
  poVar1 = std::operator<<(poVar1," MIS size: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sol->misSize);
  poVar1 = std::operator<<(poVar1," nDefPicks: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sol->nDefaultPicks);
  poVar1 = std::operator<<(poVar1," nStratPicks: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sol->nStratPicks);
  poVar1 = std::operator<<(poVar1," nDefBranchings: ");
  this = (void *)std::ostream::operator<<(poVar1,sol->nDefaultBranchings);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void writeResult(Result& sol, std::ostream &f) {
    f << "Instance: " << sol.instance
      << " branches: " << sol.nBranchings 
      << " time: " << sol.time 
      << " MIS size: " << sol.misSize
      << " nDefPicks: " << sol.nDefaultPicks
      << " nStratPicks: " << sol.nStratPicks
      << " nDefBranchings: " << sol.nDefaultBranchings
      << std::endl;
}